

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O2

void ppmd_write(void *p,Byte b)

{
  long lVar1;
  Byte *pBVar2;
  long *plVar3;
  
  lVar1 = *(long *)(*p + 0xf8);
  if (*(long *)(lVar1 + 0xa8) == 0) {
    lVar1 = *(long *)(lVar1 + 0xd0);
    pBVar2 = *(Byte **)(lVar1 + 0x4b30);
    if (*(Byte **)(lVar1 + 0x4b38) <= pBVar2) {
      return;
    }
    *(Byte **)(lVar1 + 0x4b30) = pBVar2 + 1;
    *pBVar2 = b;
    plVar3 = (long *)(lVar1 + 0x4b40);
  }
  else {
    pBVar2 = *(Byte **)(lVar1 + 0xa0);
    *(Byte **)(lVar1 + 0xa0) = pBVar2 + 1;
    *pBVar2 = b;
    *(long *)(lVar1 + 0xa8) = *(long *)(lVar1 + 0xa8) + -1;
    plVar3 = (long *)(lVar1 + 0xb0);
  }
  *plVar3 = *plVar3 + 1;
  return;
}

Assistant:

static void
ppmd_write(void *p, Byte b)
{
	struct archive_write *a = ((IByteOut *)p)->a;
	struct _7zip *zip = (struct _7zip *)(a->format_data);
	struct la_zstream *lastrm = &(zip->stream);
	struct ppmd_stream *strm;

	if (lastrm->avail_out) {
		*lastrm->next_out++ = b;
		lastrm->avail_out--;
		lastrm->total_out++;
		return;
	}
	strm = (struct ppmd_stream *)lastrm->real_stream;
	if (strm->buff_ptr < strm->buff_end) {
		*strm->buff_ptr++ = b;
		strm->buff_bytes++;
	}
}